

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void la_global_sync(TCGContext_conflict9 *s,int ng)

{
  int iVar1;
  long lVar2;
  
  if (0 < ng) {
    lVar2 = 0;
    do {
      iVar1 = *(int *)((long)&s->temps[0].state + lVar2);
      *(ulong *)((long)&s->temps[0].state + lVar2) = (long)iVar1 | 2;
      if (iVar1 == 1) {
        **(TCGRegSet **)((long)&s->temps[0].state_ptr + lVar2) =
             s->tcg_target_available_regs[(byte)(&s->temps[0].field_0x3)[lVar2]];
      }
      lVar2 = lVar2 + 0x38;
    } while ((ulong)(uint)ng * 0x38 - lVar2 != 0);
  }
  return;
}

Assistant:

static void la_global_sync(TCGContext *s, int ng)
{
    int i;

    for (i = 0; i < ng; ++i) {
        int state = s->temps[i].state;
        s->temps[i].state = state | TS_MEM;
        if (state == TS_DEAD) {
            /* If the global was previously dead, reset prefs.  */
            la_reset_pref(s, &s->temps[i]);
        }
    }
}